

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O0

bool Memory::
     SmallNormalHeapBucketBase<Memory::SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
     ::RescanObjectsOnPage
               (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block,
               char *pageAddress,char *blockStartAddress,BVStatic<256UL> *heapBlockMarkBits,
               uint localObjectSize,uint bucketIndex,bool *anyObjectRescanned,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  uint uVar6;
  uint pageStartBitIndex_00;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  char *objectAddress_00;
  BlockInfo *pBVar11;
  SmallHeapBlockBitVector *this;
  undefined8 *in_FS_OFFSET;
  uint local_8c;
  uint i;
  char *objectAddress;
  uint bitIndex;
  uint objectIndex;
  uint rescanCount;
  uint objectBitDelta;
  uint localObjectCount;
  uint pageObjectCount;
  uint rescanMarkCount;
  bool lastObjectOnPreviousPageMarked;
  BlockInfo *blockInfoForPage;
  ushort pageNumber;
  uint pageStartBitIndex;
  uint startBitIndex;
  char *startObjectAddress;
  uint firstObjectOnPageIndex;
  uint pageByteOffset;
  uint bucketIndex_local;
  uint localObjectSize_local;
  BVStatic<256UL> *heapBlockMarkBits_local;
  char *blockStartAddress_local;
  char *pageAddress_local;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *block_local;
  
  (recycler->collectionStats).markData.rescanPageCount =
       (recycler->collectionStats).markData.rescanPageCount + 1;
  bVar2 = BVStatic<256UL>::IsAllClear(heapBlockMarkBits);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,100,"(!heapBlockMarkBits->IsAllClear())","!heapBlockMarkBits->IsAllClear()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = false;
  }
  if (0xfff < (ulong)((long)pageAddress - (long)blockStartAddress)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x6b,
                       "((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize)"
                       ,
                       "(char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar6 = (int)pageAddress - (int)blockStartAddress;
  objectAddress._4_4_ = uVar6 / localObjectSize;
  objectAddress_00 = blockStartAddress + objectAddress._4_4_ * localObjectSize;
  uVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddressBitIndex(objectAddress_00);
  objectAddress._0_4_ = (uint)uVar5;
  pageStartBitIndex_00 = uVar6 >> 4;
  if (0xfffe < uVar6 >> 0xc) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x77,"(pageByteOffset / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                       "pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pBVar11 = HeapInfo::GetBlockInfo<SmallAllocationBlockAttributes>(localObjectSize);
  bVar2 = false;
  localObjectCount =
       SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
                 (heapBlockMarkBits,bucketIndex,pageStartBitIndex_00);
  uVar7 = (uint)pBVar11[(ushort)(uVar6 >> 0xc)].pageObjectCount;
  uVar8 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(localObjectSize),0);
  if (objectAddress._4_4_ < uVar8) {
    bVar3 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::CanRescanFullBlock();
    if ((bVar3) && (localObjectCount == uVar7)) {
      bVar2 = Recycler::AddMark(recycler,pageAddress,0x1000);
      if (bVar2) {
        (recycler->collectionStats).markData.rescanObjectCount =
             (ulong)uVar7 + (recycler->collectionStats).markData.rescanObjectCount;
        (recycler->collectionStats).markData.rescanObjectByteCount =
             (ulong)(localObjectSize * uVar7) +
             (recycler->collectionStats).markData.rescanObjectByteCount;
        if (anyObjectRescanned != (bool *)0x0) {
          *anyObjectRescanned = true;
        }
        block_local._7_1_ = true;
      }
      else {
        block_local._7_1_ = false;
      }
    }
    else {
      if (objectAddress_00 != pageAddress) {
        if ((objectAddress_00 < blockStartAddress) || (pageAddress <= objectAddress_00)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                             ,0x9f,
                             "(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress)"
                             ,
                             "startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        BVar4 = BVStatic<256UL>::Test(heapBlockMarkBits,(uint)objectAddress);
        bVar2 = BVar4 == '\x01';
        if (bVar2) {
          localObjectCount = localObjectCount + 1;
        }
      }
      uVar9 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetObjectBitDeltaForBucketIndex
                        (bucketIndex);
      bitIndex = 0;
      while (bitIndex < localObjectCount) {
        if (uVar8 <= objectAddress._4_4_) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                             ,0xae,"(objectIndex < localObjectCount)",
                             "objectIndex < localObjectCount");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        this = HeapInfo::GetInvalidBitVectorForBucket<SmallAllocationBlockAttributes>(bucketIndex);
        BVar4 = BVStatic<256UL>::Test(this,(uint)objectAddress);
        if (BVar4 != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                             ,0xaf,
                             "(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex))"
                             ,
                             "!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex)"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        BVar4 = BVStatic<256UL>::Test(heapBlockMarkBits,(uint)objectAddress);
        if (BVar4 != '\0') {
          bVar3 = SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::RescanObject
                            (&block->
                              super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,
                             blockStartAddress + objectAddress._4_4_ * localObjectSize,
                             localObjectSize,objectAddress._4_4_,recycler);
          if (!bVar3) {
            return false;
          }
          bitIndex = bitIndex + 1;
        }
        objectAddress._4_4_ = objectAddress._4_4_ + 1;
        objectAddress._0_4_ = uVar9 + (uint)objectAddress;
      }
      if ((objectAddress_00 == pageAddress) || (!bVar2)) {
        uVar10 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
                           (heapBlockMarkBits,bucketIndex,pageStartBitIndex_00);
        if (localObjectCount != uVar10) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                             ,0xc5,
                             "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex))"
                             ,
                             "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex)"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
      }
      else {
        uVar10 = SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::CalculateMarkCountForPage
                           (heapBlockMarkBits,bucketIndex,pageStartBitIndex_00);
        if (localObjectCount != uVar10 + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                             ,0xc1,
                             "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1)"
                             ,
                             "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1"
                            );
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
      }
      while (local_8c = objectAddress._4_4_ + 1,
            local_8c < pBVar11[(ushort)(uVar6 >> 0xc)].lastObjectIndexOnPage) {
        BVar4 = BVStatic<256UL>::Test(heapBlockMarkBits,local_8c * uVar9);
        objectAddress._4_4_ = local_8c;
        if (BVar4 != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                             ,0xcd,"(!heapBlockMarkBits->Test(i * objectBitDelta))",
                             "!heapBlockMarkBits->Test(i * objectBitDelta)");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
      }
      if (anyObjectRescanned != (bool *)0x0) {
        *anyObjectRescanned = bitIndex != 0;
      }
      block_local._7_1_ = true;
    }
    return block_local._7_1_;
  }
  ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,3);
}

Assistant:

bool
SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(TBlockType * block, char* pageAddress, char * blockStartAddress, BVStatic<TBlockAttributes::BitVectorCount> * heapBlockMarkBits, const uint localObjectSize, uint bucketIndex, __out_opt bool* anyObjectRescanned, Recycler * recycler)
{
    RECYCLER_STATS_ADD(recycler, markData.rescanPageCount, TBlockAttributes::PageCount);

    // By the time we get here, we should have ensured that there's a mark on any page somewhere.
    // REVIEW: Worth check on just the page's mark bits?
    Assert(!heapBlockMarkBits->IsAllClear());

    if (anyObjectRescanned != nullptr)
    {
        *anyObjectRescanned = false;
    }

    Assert((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize);
    const uint pageByteOffset = static_cast<uint>((char*)pageAddress - blockStartAddress);
    uint firstObjectOnPageIndex = pageByteOffset / localObjectSize;

    // This is not necessarily the address on the first object that starts on the page
    // If the last object on the previous page spans two pages, this is the address of that object
    // We do it this way so that we can figure out if we need to rescan the first few bytes of the page
    // if the actual first object on this page is not located at the start of the page
    char* const startObjectAddress = blockStartAddress + (firstObjectOnPageIndex * localObjectSize);
    const uint startBitIndex = TBlockType::GetAddressBitIndex(startObjectAddress);
    const uint pageStartBitIndex = pageByteOffset >> HeapConstants::ObjectAllocationShift;

    Assert(pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX);
    const ushort pageNumber = static_cast<const ushort>(pageByteOffset / AutoSystemInfo::PageSize);
    const typename TBlockType::BlockInfo& blockInfoForPage = HeapInfo::GetBlockInfo<TBlockAttributes>(localObjectSize)[pageNumber];

    bool lastObjectOnPreviousPageMarked = false;
    // Calculate the mark count here since we no longer keep track during marking
    uint rescanMarkCount = TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex);
    const uint pageObjectCount = blockInfoForPage.pageObjectCount;
    const uint localObjectCount = (TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / localObjectSize;

    // With protected unallocatable ending pages and reset writewatch, we should never be scanning on these pages.
    if (firstObjectOnPageIndex >= localObjectCount)
    {
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 3);
    }

    // If all objects are marked, rescan whole block at once
    if (TBlockType::CanRescanFullBlock() && rescanMarkCount == pageObjectCount)
    {
        // REVIEW: Can we optimize this more?
        if (!recycler->AddMark(pageAddress, AutoSystemInfo::PageSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_ADD(recycler, markData.rescanObjectCount, pageObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize * pageObjectCount);
        if (anyObjectRescanned != nullptr)
        {
            *anyObjectRescanned = true;
        }

        return true;
    }

    if (startObjectAddress != pageAddress)
    {
        // If the last object on the previous page that spans into the current page is marked,
        // we need to count that in the markCount for rescan
        Assert(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress);
        lastObjectOnPreviousPageMarked = (heapBlockMarkBits->Test(startBitIndex) == TRUE);
        if (lastObjectOnPreviousPageMarked)
        {
            rescanMarkCount++;
        }
    }

    const uint objectBitDelta = SmallHeapBlockT<TBlockAttributes>::GetObjectBitDeltaForBucketIndex(bucketIndex);

    uint rescanCount = 0;
    uint objectIndex = firstObjectOnPageIndex;

    for (uint bitIndex = startBitIndex; rescanCount < rescanMarkCount; objectIndex++, bitIndex += objectBitDelta)
    {
        Assert(objectIndex < localObjectCount);
        Assert(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex));

        if (heapBlockMarkBits->Test(bitIndex))
        {
            char * objectAddress = blockStartAddress + objectIndex * localObjectSize;
            if (!TBlockType::RescanObject(block, objectAddress, localObjectSize, objectIndex, recycler))
            {
                // Failed to add to the mark stack due to OOM.
                return false;
            }

            rescanCount++;
        }
    }

    // Mark bits should not have changed during the Rescan
    if (startObjectAddress != pageAddress && lastObjectOnPreviousPageMarked)
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1);
    }
    else
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex));
    }

#if DBG
    // We stopped when we hit the rescanMarkCount.
    // Make sure no other objects were marked, otherwise our rescanMarkCount was wrong.
    for (uint i = objectIndex + 1; i < blockInfoForPage.lastObjectIndexOnPage; i++)
    {
        Assert(!heapBlockMarkBits->Test(i * objectBitDelta));
    }
#endif

    // Let the caller know if we rescanned anything on this page
    if (anyObjectRescanned != nullptr)
    {
        (*anyObjectRescanned) = (rescanCount > 0);
    }

    return true;
}